

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPGEX_TransformedView.h
# Opt level: O1

void __thiscall
olc::TransformedView::DrawSprite
          (TransformedView *this,vf2d *pos,Sprite *sprite,vf2d *scale,uint8_t flip)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  Pixel PVar4;
  float fVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  vi2d vStart;
  float local_38;
  float local_34;
  
  iVar6 = sprite->width;
  iVar3 = sprite->height;
  local_38 = scale->x * (float)iVar6;
  local_34 = scale->y * (float)iVar3;
  iVar2 = (*(this->super_PGEX)._vptr_PGEX[10])();
  if ((char)iVar2 != '\0') {
    fVar10 = (float)iVar6 * (this->m_vRecipPixel).x * (this->m_vWorldScale).x * scale->x;
    fVar11 = (float)iVar3 * (this->m_vRecipPixel).y * (this->m_vWorldScale).y * scale->y;
    (*(this->super_PGEX)._vptr_PGEX[5])(&local_38,this,pos);
    fVar7 = (float)(int)((float)(int)local_34 + fVar11);
    if ((int)local_34 < (int)fVar7) {
      fVar8 = (float)(int)((float)(int)local_38 + fVar10);
      fVar5 = local_34;
      do {
        fVar9 = local_38;
        if ((int)local_38 < (int)fVar8) {
          do {
            plVar1 = PGEX::pge;
            iVar3 = (int)((float)sprite->width *
                         (float)((int)fVar9 - (int)local_38) * (1.0 / fVar10));
            iVar6 = sprite->width + -1;
            if (iVar3 <= iVar6) {
              iVar6 = iVar3;
            }
            iVar2 = (int)((float)sprite->height *
                         (float)((int)fVar5 - (int)local_34) * (1.0 / fVar11));
            iVar3 = sprite->height + -1;
            if (iVar2 <= iVar3) {
              iVar3 = iVar2;
            }
            PVar4 = Sprite::GetPixel(sprite,iVar6,iVar3);
            (**(code **)(*plVar1 + 0x28))(plVar1,fVar9,fVar5,PVar4.field_0);
            fVar9 = (float)((int)fVar9 + 1);
          } while (fVar8 != fVar9);
        }
        fVar5 = (float)((int)fVar5 + 1);
      } while (fVar5 != fVar7);
    }
  }
  return;
}

Assistant:

void TransformedView::DrawSprite(const olc::vf2d & pos, olc::Sprite * sprite, const olc::vf2d & scale, uint8_t flip)
	{
		olc::vf2d vSpriteSize = olc::vf2d(float(sprite->width), float(sprite->height));
		if (IsRectVisible(pos, vSpriteSize * scale))
		{
			olc::vf2d vSpriteScaledSize = vSpriteSize * m_vRecipPixel * m_vWorldScale * scale;
			olc::vi2d vPixel, vStart = WorldToScreen(pos), vEnd = vSpriteScaledSize + vStart;
			olc::vf2d vPixelStep = 1.0f / vSpriteScaledSize;
			for (vPixel.y = vStart.y; vPixel.y < vEnd.y; vPixel.y++)
			{
				for (vPixel.x = vStart.x; vPixel.x < vEnd.x; vPixel.x++)
				{
					olc::vf2d vSample = olc::vf2d(vPixel - vStart) * vPixelStep;
					pge->Draw(vPixel, sprite->Sample(vSample.x, vSample.y));
				}
			}
		}
	}